

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cxx
# Opt level: O3

void __thiscall trento::Output::Output(Output *this,VarMap *var_map)

{
  pointer *ppfVar1;
  undefined1 auVar2 [16];
  pointer pcVar3;
  pointer pfVar4;
  _Manager_type p_Var5;
  undefined8 uVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  any *paVar10;
  int *piVar11;
  bool *pbVar12;
  long lVar13;
  pointer pfVar14;
  const_iterator cVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  runtime_error *prVar16;
  long *plVar17;
  size_type sVar18;
  function<void_(int,_double,_int,_const_trento::Event_&)> *pfVar19;
  pointer pfVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  anon_class_40_3_2e487188 *__args;
  anon_class_40_3_2e487188 *extraout_RDX;
  anon_class_40_3_2e487188 *extraout_RDX_00;
  anon_class_40_3_2e487188 *__args_00;
  function<void_(int,_double,_int,_const_trento::Event_&)> *__cur_1;
  pointer pfVar22;
  function<void_(int,_double,_int,_const_trento::Event_&)> *__cur;
  function<void_(int,_double,_int,_const_trento::Event_&)> *pfVar23;
  double dVar24;
  undefined8 extraout_XMM1_Qa;
  undefined1 extraout_var [56];
  _Any_data local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  int local_60;
  byte local_5c;
  pointer local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 auVar26 [64];
  undefined1 auVar25 [16];
  
  (this->writers_).
  super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->writers_).
  super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->writers_).
  super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80._M_unused._M_object = &local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"number-events","");
  paVar10 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  piVar11 = boost::any_cast<int_const&>(paVar10);
  iVar9 = *piVar11;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_unused._0_8_ != &local_70) {
    operator_delete(local_80._M_unused._M_object);
  }
  dVar24 = log10((double)iVar9);
  local_80._M_unused._M_object = &local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"quiet","");
  paVar10 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  auVar26._8_56_ = extraout_var;
  auVar26._0_8_ = extraout_XMM1_Qa;
  auVar25 = auVar26._0_16_;
  pbVar12 = boost::any_cast<bool_const&>(paVar10);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = dVar24;
  auVar2 = vroundsd_avx(auVar25,auVar2,10);
  bVar7 = *pbVar12;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_unused._0_8_ != &local_70) {
    operator_delete(local_80._M_unused._M_object);
  }
  iVar9 = (int)auVar2._0_8_;
  if (bVar7 == false) {
    pfVar22 = (this->writers_).
              super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pfVar22 ==
        (this->writers_).
        super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      sVar18 = std::
               vector<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
               ::_M_check_len(&this->writers_,1,"vector::_M_realloc_insert");
      local_58 = (this->writers_).
                 super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pfVar4 = (this->writers_).
               super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (sVar18 == 0) {
        pfVar19 = (function<void_(int,_double,_int,_const_trento::Event_&)> *)0x0;
      }
      else {
        pfVar19 = __gnu_cxx::
                  new_allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>::
                  allocate((new_allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>
                            *)this,sVar18,(void *)0x0);
      }
      lVar13 = (long)pfVar22 - (long)local_58 >> 5;
      *(undefined8 *)&pfVar19[lVar13].super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&pfVar19[lVar13].super__Function_base._M_functor + 8) = 0;
      *(int *)&pfVar19[lVar13].super__Function_base._M_functor = iVar9;
      pfVar19[lVar13]._M_invoker =
           std::
           _Function_handler<void_(int,_double,_int,_const_trento::Event_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Duke-QCD[P]trento/src/output.cxx:176:7)>
           ::_M_invoke;
      pfVar19[lVar13].super__Function_base._M_manager =
           std::
           _Function_handler<void_(int,_double,_int,_const_trento::Event_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Duke-QCD[P]trento/src/output.cxx:176:7)>
           ::_M_manager;
      pfVar23 = pfVar19;
      for (pfVar14 = local_58; pfVar14 != pfVar22; pfVar14 = pfVar14 + 1) {
        *(undefined8 *)&(pfVar23->super__Function_base)._M_functor = 0;
        *(undefined8 *)((long)&(pfVar23->super__Function_base)._M_functor + 8) = 0;
        (pfVar23->super__Function_base)._M_manager = (_Manager_type)0x0;
        pfVar23->_M_invoker = pfVar14->_M_invoker;
        p_Var5 = (pfVar14->super__Function_base)._M_manager;
        if (p_Var5 != (_Manager_type)0x0) {
          (pfVar23->super__Function_base)._M_functor = (pfVar14->super__Function_base)._M_functor;
          (pfVar23->super__Function_base)._M_manager = p_Var5;
          (pfVar14->super__Function_base)._M_manager = (_Manager_type)0x0;
          pfVar14->_M_invoker = (_Invoker_type)0x0;
        }
        pfVar23 = pfVar23 + 1;
      }
      for (; pfVar23 = pfVar23 + 1, pfVar4 != pfVar22; pfVar22 = pfVar22 + 1) {
        *(undefined8 *)&(pfVar23->super__Function_base)._M_functor = 0;
        *(undefined8 *)((long)&(pfVar23->super__Function_base)._M_functor + 8) = 0;
        (pfVar23->super__Function_base)._M_manager = (_Manager_type)0x0;
        pfVar23->_M_invoker = pfVar22->_M_invoker;
        p_Var5 = (pfVar22->super__Function_base)._M_manager;
        if (p_Var5 != (_Manager_type)0x0) {
          (pfVar23->super__Function_base)._M_functor = (pfVar22->super__Function_base)._M_functor;
          (pfVar23->super__Function_base)._M_manager = p_Var5;
          (pfVar22->super__Function_base)._M_manager = (_Manager_type)0x0;
          pfVar22->_M_invoker = (_Invoker_type)0x0;
        }
      }
      if (local_58 != (pointer)0x0) {
        operator_delete(local_58);
      }
      (this->writers_).
      super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pfVar19;
      (this->writers_).
      super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pfVar23;
      (this->writers_).
      super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pfVar19 + sVar18;
    }
    else {
      *(undefined8 *)&(pfVar22->super__Function_base)._M_functor = 0;
      *(undefined8 *)((long)&(pfVar22->super__Function_base)._M_functor + 8) = 0;
      *(int *)&(pfVar22->super__Function_base)._M_functor = iVar9;
      pfVar22->_M_invoker =
           std::
           _Function_handler<void_(int,_double,_int,_const_trento::Event_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Duke-QCD[P]trento/src/output.cxx:176:7)>
           ::_M_invoke;
      (pfVar22->super__Function_base)._M_manager =
           std::
           _Function_handler<void_(int,_double,_int,_const_trento::Event_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Duke-QCD[P]trento/src/output.cxx:176:7)>
           ::_M_manager;
      ppfVar1 = &(this->writers_).
                 super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppfVar1 = *ppfVar1 + 1;
    }
  }
  local_80._M_unused._M_object = &local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"output","");
  cVar15 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)(var_map + 0x10),(key_type *)&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_unused._0_8_ != &local_70) {
    operator_delete(local_80._M_unused._M_object);
  }
  if (cVar15._M_node != (_Base_ptr)(var_map + 0x18)) {
    local_80._M_unused._M_object = &local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"output","");
    paVar10 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
    __rhs = &boost::any_cast<boost::filesystem::path_const&>(paVar10)->m_pathname;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_unused._0_8_ != &local_70) {
      operator_delete(local_80._M_unused._M_object);
    }
    bVar7 = hdf5::filename_is_hdf5((path *)__rhs);
    if (bVar7) {
      prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar16,"HDF5 output was not compiled");
      __cxa_throw(prVar16,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    boost::filesystem::detail::status((path *)&local_80,(error_code *)__rhs);
    if ((uint)local_80._0_4_ < 2) {
      boost::filesystem::detail::create_directories((path *)__rhs,(error_code *)0x0);
    }
    else {
      cVar8 = boost::filesystem::detail::is_empty((path *)__rhs,(error_code *)0x0);
      if (cVar8 == '\0') {
        prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_50,"output directory \'",__rhs);
        plVar17 = (long *)std::__cxx11::string::append((char *)&local_50);
        paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar17 + 2);
        local_80._M_unused._0_8_ = (undefined8)*plVar17;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_unused._0_8_ == paVar21) {
          local_70._M_allocated_capacity = paVar21->_M_allocated_capacity;
          local_70._8_8_ = plVar17[3];
          local_80._M_unused._M_object = &local_70;
        }
        else {
          local_70._M_allocated_capacity = paVar21->_M_allocated_capacity;
        }
        local_80._8_8_ = plVar17[1];
        *plVar17 = (long)paVar21;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        std::runtime_error::runtime_error(prVar16,(string *)local_80._M_pod_data);
        __cxa_throw(prVar16,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    local_80._M_unused._M_object = &local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"no-header","");
    paVar10 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
    pbVar12 = boost::any_cast<bool_const&>(paVar10);
    bVar7 = *pbVar12;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_unused._0_8_ != &local_70) {
      operator_delete(local_80._M_unused._M_object);
    }
    pcVar3 = (__rhs->_M_dataplus)._M_p;
    local_80._M_unused._M_object = &local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,pcVar3,pcVar3 + __rhs->_M_string_length);
    local_5c = bVar7 ^ 1;
    pfVar22 = (this->writers_).
              super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_60 = iVar9;
    if (pfVar22 ==
        (this->writers_).
        super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      sVar18 = std::
               vector<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
               ::_M_check_len(&this->writers_,1,"vector::_M_realloc_insert");
      pfVar4 = (this->writers_).
               super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pfVar14 = (this->writers_).
                super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (sVar18 == 0) {
        pfVar19 = (function<void_(int,_double,_int,_const_trento::Event_&)> *)0x0;
        __args_00 = extraout_RDX;
      }
      else {
        pfVar19 = __gnu_cxx::
                  new_allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>::
                  allocate((new_allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>
                            *)this,sVar18,(void *)0x0);
        __args_00 = extraout_RDX_00;
      }
      std::
      allocator_traits<std::allocator<std::function<void(int,double,int,trento::Event_const&)>>>::
      construct<std::function<void(int,double,int,trento::Event_const&)>,trento::Output::Output(boost::program_options::variables_map_const&)::__1>
                ((allocator_type *)(pfVar19 + ((long)pfVar22 - (long)pfVar4 >> 5)),
                 (function<void_(int,_double,_int,_const_trento::Event_&)> *)&local_80,__args_00);
      pfVar23 = pfVar19;
      for (pfVar20 = pfVar4; pfVar20 != pfVar22; pfVar20 = pfVar20 + 1) {
        *(undefined8 *)&(pfVar23->super__Function_base)._M_functor = 0;
        *(undefined8 *)((long)&(pfVar23->super__Function_base)._M_functor + 8) = 0;
        (pfVar23->super__Function_base)._M_manager = (_Manager_type)0x0;
        pfVar23->_M_invoker = pfVar20->_M_invoker;
        p_Var5 = (pfVar20->super__Function_base)._M_manager;
        if (p_Var5 != (_Manager_type)0x0) {
          uVar6 = *(undefined8 *)((long)&(pfVar20->super__Function_base)._M_functor + 8);
          *(undefined8 *)&(pfVar23->super__Function_base)._M_functor =
               *(undefined8 *)&(pfVar20->super__Function_base)._M_functor;
          *(undefined8 *)((long)&(pfVar23->super__Function_base)._M_functor + 8) = uVar6;
          (pfVar23->super__Function_base)._M_manager = p_Var5;
          (pfVar20->super__Function_base)._M_manager = (_Manager_type)0x0;
          pfVar20->_M_invoker = (_Invoker_type)0x0;
        }
        pfVar23 = pfVar23 + 1;
      }
      for (; pfVar23 = pfVar23 + 1, pfVar14 != pfVar22; pfVar22 = pfVar22 + 1) {
        *(undefined8 *)&(pfVar23->super__Function_base)._M_functor = 0;
        *(undefined8 *)((long)&(pfVar23->super__Function_base)._M_functor + 8) = 0;
        (pfVar23->super__Function_base)._M_manager = (_Manager_type)0x0;
        pfVar23->_M_invoker = pfVar22->_M_invoker;
        p_Var5 = (pfVar22->super__Function_base)._M_manager;
        if (p_Var5 != (_Manager_type)0x0) {
          uVar6 = *(undefined8 *)((long)&(pfVar22->super__Function_base)._M_functor + 8);
          *(undefined8 *)&(pfVar23->super__Function_base)._M_functor =
               *(undefined8 *)&(pfVar22->super__Function_base)._M_functor;
          *(undefined8 *)((long)&(pfVar23->super__Function_base)._M_functor + 8) = uVar6;
          (pfVar23->super__Function_base)._M_manager = p_Var5;
          (pfVar22->super__Function_base)._M_manager = (_Manager_type)0x0;
          pfVar22->_M_invoker = (_Invoker_type)0x0;
        }
      }
      if (pfVar4 != (pointer)0x0) {
        operator_delete(pfVar4);
      }
      (this->writers_).
      super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pfVar19;
      (this->writers_).
      super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pfVar23;
      (this->writers_).
      super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pfVar19 + sVar18;
    }
    else {
      std::
      allocator_traits<std::allocator<std::function<void(int,double,int,trento::Event_const&)>>>::
      construct<std::function<void(int,double,int,trento::Event_const&)>,trento::Output::Output(boost::program_options::variables_map_const&)::__1>
                ((allocator_type *)pfVar22,
                 (function<void_(int,_double,_int,_const_trento::Event_&)> *)&local_80,__args);
      ppfVar1 = &(this->writers_).
                 super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppfVar1 = *ppfVar1 + 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_unused._0_8_ != &local_70) {
      operator_delete(local_80._M_unused._M_object);
    }
  }
  return;
}

Assistant:

Output::Output(const VarMap& var_map) {
  // Determine the required width (padding) of the event number.  For example if
  // there are 10 events, the numbers are 0-9 and so no padding is necessary.
  // However given 11 events, the numbers are 00-10 with padded 00, 01, ...
  auto nevents = var_map["number-events"].as<int>();
  auto width = static_cast<int>(std::ceil(std::log10(nevents)));

  // Write to stdout unless the quiet option was specified.
  if (!var_map["quiet"].as<bool>()) {
    writers_.emplace_back(
      [width](int num, double impact_param, int ncoll, const Event& event) {
        write_stream(std::cout, width, num, impact_param, ncoll, event);
      }
    );
  }

  // Possibly write to text or HDF5 files.
  if (var_map.count("output")) {
    const auto& output_path = var_map["output"].as<fs::path>();
    if (hdf5::filename_is_hdf5(output_path)) {
#ifdef TRENTO_HDF5
      if (fs::exists(output_path) && !fs::is_empty(output_path))
        throw std::runtime_error{"file '" + output_path.string() +
                                 "' exists, will not overwrite"};
      writers_.emplace_back(HDF5Writer{output_path});
#else
      throw std::runtime_error{"HDF5 output was not compiled"};
#endif  // TRENTO_HDF5
    } else {
      // Text files are all written into a single directory.  Require the
      // directory to be initially empty to avoid accidental overwriting and/or
      // spewing files into an already-used location.  If the directory does not
      // exist, create it.
      if (fs::exists(output_path)) {
        if (!fs::is_empty(output_path)) {
          throw std::runtime_error{"output directory '" + output_path.string() +
                                   "' must be empty"};
        }
      } else {
        fs::create_directories(output_path);
      }
      auto header = !var_map["no-header"].as<bool>();
      writers_.emplace_back(
        [output_path, width, header](int num, double impact_param,
          int ncoll, const Event& event) {
          write_text_file(output_path, width, num,
              impact_param, ncoll, event, header);
        }
      );
    }
  }
}